

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Output::preflightFlowElement(Output *this,uint param_1,void **param_2)

{
  int i;
  int iVar1;
  StringRef s;
  StringRef s_00;
  StringRef s_01;
  StringRef s_02;
  
  if (this->NeedFlowSequenceComma == true) {
    s.Length = 2;
    s.Data = ", ";
    output(this,s);
  }
  if ((this->WrapColumn != 0) && (this->WrapColumn < this->Column)) {
    s_00.Length = 1;
    s_00.Data = "\n";
    output(this,s_00);
    for (iVar1 = 0; iVar1 < this->ColumnAtFlowStart; iVar1 = iVar1 + 1) {
      s_01.Length = 1;
      s_01.Data = " ";
      output(this,s_01);
    }
    this->Column = this->ColumnAtFlowStart;
    s_02.Length = 2;
    s_02.Data = "  ";
    output(this,s_02);
  }
  return true;
}

Assistant:

bool Output::preflightFlowElement(unsigned, void *&) {
  if (NeedFlowSequenceComma)
    output(", ");
  if (WrapColumn && Column > WrapColumn) {
    output("\n");
    for (int i = 0; i < ColumnAtFlowStart; ++i)
      output(" ");
    Column = ColumnAtFlowStart;
    output("  ");
  }
  return true;
}